

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void libtorrent::aux::utp_stream::on_writeable(utp_stream *s,error_code *ec)

{
  io_context *ctx;
  type local_48;
  error_code *local_18;
  error_code *ec_local;
  utp_stream *s_local;
  
  ctx = s->m_io_service;
  local_18 = ec;
  ec_local = (error_code *)s;
  ::std::
  bind<void,std::function<void(boost::system::error_code_const&)>,boost::system::error_code_const&>
            (&local_48,&s->m_writeable_handler,ec);
  boost::asio::
  post<boost::asio::io_context,std::_Bind_result<void,std::function<void(boost::system::error_code_const&)>(boost::system::error_code)>>
            (ctx,&local_48,(type *)0x0);
  ::std::
  _Bind_result<void,_std::function<void_(const_boost::system::error_code_&)>_(boost::system::error_code)>
  ::~_Bind_result(&local_48);
  ::std::function<void_(const_boost::system::error_code_&)>::operator=
            ((function<void_(const_boost::system::error_code_&)> *)(ec_local + 6),(nullptr_t)0x0);
  return;
}

Assistant:

void utp_stream::on_writeable(utp_stream* s, error_code const& ec)
{
	UTP_LOGV("%8p: calling writeable handler ec:%s\n"
		, static_cast<void*>(s->m_impl)
		, ec.message().c_str());

	TORRENT_ASSERT(s->m_writeable_handler);
	post(s->m_io_service, std::bind<void>(std::move(s->m_writeable_handler), ec));
	s->m_writeable_handler = nullptr;
}